

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O3

void __thiscall
testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>::
depart(linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> *this)

{
  TestInfo *pTVar1;
  pointer pcVar2;
  bool bVar3;
  
  bVar3 = linked_ptr_internal::depart(&this->link_);
  if (bVar3) {
    pTVar1 = this->value_;
    if (pTVar1 != (TestInfo *)0x0) {
      scoped_ptr<testing::internal::TestMetaFactoryBase<unsigned_long>_>::reset
                (&pTVar1->test_meta_factory,(TestMetaFactoryBase<unsigned_long> *)0x0);
      pcVar2 = (pTVar1->test_base_name)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(pTVar1->test_base_name).field_2) {
        operator_delete(pcVar2);
      }
      pcVar2 = (pTVar1->test_case_base_name)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(pTVar1->test_case_base_name).field_2) {
        operator_delete(pcVar2);
      }
    }
    operator_delete(pTVar1);
    return;
  }
  return;
}

Assistant:

void depart() {
    if (link_.depart()) delete value_;
  }